

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  PolicyStatus PVar9;
  cmake *pcVar10;
  cmTarget *pcVar11;
  ostream *poVar12;
  size_t sVar13;
  ulong uVar14;
  char *pcVar15;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  LinkLibraryType llt;
  MessageType t;
  pointer pbVar16;
  int iVar17;
  ulong uVar18;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == name) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_002b4e3f:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  bVar4 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
  if (bVar4) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"can not be used on an ALIAS target.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    goto LAB_002b4e3f;
  }
  pcVar10 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  pcVar11 = cmGlobalGenerator::FindTarget
                      (pcVar10->GlobalGenerator,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,false);
  this->Target = pcVar11;
  if (pcVar11 == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot specify link libraries for target \"",0x2a);
    pbVar16 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(pbVar16->_M_dataplus)._M_p,pbVar16->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"which is not built by this project.",0x23);
    iVar7 = 1;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      PVar9 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016);
      if (PVar9 - REQUIRED_IF_USED < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c8,(cmPolicies *)0x10,id_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      else if (PVar9 == OLD) {
        iVar7 = 3;
      }
      else if (PVar9 == WARN) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "CMake does not support this but it used to work accidentally ",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"and is being allowed for compatibility.",0x27);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x10,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        iVar7 = 0;
      }
    }
    if (iVar7 == 1) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
LAB_002b586c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else if (iVar7 == 0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    if (pcVar11->TargetTypeValue == UTILITY) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar9 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039);
      if (PVar9 - NEW < 3) {
        t = FATAL_ERROR;
        bVar3 = true;
        pcVar15 = "must";
        bVar4 = false;
      }
      else {
        if (PVar9 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x27,id_00);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                               local_1c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          bVar4 = false;
          pcVar15 = "should";
        }
        else {
          pcVar15 = (char *)0x0;
          bVar4 = true;
        }
        bVar3 = false;
        t = AUTHOR_WARNING;
      }
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Utility target \"",0x10);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                             (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" ",2);
        sVar13 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar15,sVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," not be used as the target of a target_link_libraries call.",0x3b);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,t,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          return false;
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else if (pcVar11->TargetTypeValue == OBJECT_LIBRARY) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Object library target \"",0x17);
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(pbVar16->_M_dataplus)._M_p,
                           pbVar16->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"may not link to anything.",0x19);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      goto LAB_002b586c;
    }
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      this->CurrentProcessingState = ProcessingLinkLibraries;
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = 0x20 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16);
      if (bVar4) {
        bVar3 = false;
        llt = GENERAL;
        uVar14 = 1;
        uVar18 = 2;
LAB_002b52e2:
        iVar7 = std::__cxx11::string::compare((char *)(pbVar16 + uVar14));
        iVar17 = (int)uVar18;
        if (iVar7 == 0) {
          this->CurrentProcessingState = ProcessingPlainLinkInterface;
          if (iVar17 != 2) {
            pcVar1 = (this->super_cmCommand).Makefile;
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,
                       "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                       ,"");
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
LAB_002b58f9:
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_002b5903:
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
LAB_002b5910:
            bVar6 = true;
            goto LAB_002b5641;
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14));
          if (iVar7 == 0) {
            if ((iVar17 != 2) &&
               ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
              pcVar1 = (this->super_cmCommand).Makefile;
              local_1a8._0_8_ = local_1a8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,
                         "The INTERFACE option must appear as the second argument, just after the target name."
                         ,"");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
              goto LAB_002b58f9;
            }
            this->CurrentProcessingState = ProcessingKeywordLinkInterface;
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar7 == 0) {
              if (((iVar17 != 2) && (this->CurrentProcessingState != ProcessingPlainPublicInterface)
                  ) && (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                local_1a8._0_8_ = local_1a8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,"");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
                goto LAB_002b58f9;
              }
              this->CurrentProcessingState = ProcessingPlainPublicInterface;
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar7 == 0) {
                if ((iVar17 != 2) &&
                   ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                    ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  local_1a8._0_8_ = local_1a8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,
                             "The PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,"");
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
                  goto LAB_002b58f9;
                }
                this->CurrentProcessingState = ProcessingKeywordPublicInterface;
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar7 == 0) {
                  if (((iVar17 != 2) &&
                      (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
                     (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                    pcVar1 = (this->super_cmCommand).Makefile;
                    local_1a8._0_8_ = local_1a8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,"");
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
                    goto LAB_002b58f9;
                  }
                  this->CurrentProcessingState = ProcessingPlainPrivateInterface;
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar14));
                  if (iVar7 == 0) {
                    if ((iVar17 != 2) &&
                       ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                        ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                      pcVar1 = (this->super_cmCommand).Makefile;
                      local_1a8._0_8_ = local_1a8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1a8,
                                 "The PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,"");
                      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
                      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_002b5903;
                      goto LAB_002b5910;
                    }
                    this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar14)
                                      );
                    if (iVar7 == 0) {
                      if (bVar3) {
                        LinkLibraryTypeSpecifierWarning(this,llt,1);
                      }
                      llt = DEBUG;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar14));
                      if (iVar7 == 0) {
                        if (bVar3) {
                          LinkLibraryTypeSpecifierWarning(this,llt,2);
                        }
                        llt = OPTIMIZED;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14));
                        if (iVar7 != 0) {
                          if (!bVar3) {
                            pbVar16 = (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start;
                            local_1a8._0_8_ = local_1a8 + 0x10;
                            pcVar2 = (pbVar16->_M_dataplus)._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)local_1a8,pcVar2,pcVar2 + pbVar16->_M_string_length
                                      );
                            std::__cxx11::string::append(local_1a8);
                            pcVar15 = cmMakefile::GetDefinition
                                                ((this->super_cmCommand).Makefile,
                                                 (string *)local_1a8);
                            if (pcVar15 == (char *)0x0) {
                              llt = GENERAL;
                            }
                            else {
                              iVar7 = strcmp(pcVar15,"debug");
                              iVar8 = strcmp(pcVar15,"optimized");
                              llt = OPTIMIZED;
                              if (iVar8 != 0) {
                                llt = (LinkLibraryType)(iVar7 == 0);
                              }
                            }
                            bVar6 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,llt);
                            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                            }
                            if (bVar6) goto LAB_002b554a;
                            goto LAB_002b563f;
                          }
                          bVar5 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,llt);
                          bVar3 = false;
                          bVar6 = false;
                          if (!bVar5) goto LAB_002b5641;
                          goto LAB_002b554a;
                        }
                        if (bVar3) {
                          LinkLibraryTypeSpecifierWarning(this,llt,0);
                        }
                        llt = GENERAL;
                      }
                    }
                    bVar3 = true;
                  }
                }
              }
            }
          }
        }
LAB_002b554a:
        pbVar16 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar14 = (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16 >> 5;
        bVar4 = uVar18 < uVar14;
        bVar6 = uVar14 <= uVar18;
        uVar14 = uVar18;
        uVar18 = (ulong)(iVar17 + 1);
        if (bVar6) goto LAB_002b563f;
        goto LAB_002b52e2;
      }
      llt = GENERAL;
      bVar3 = false;
LAB_002b563f:
      bVar6 = false;
LAB_002b5641:
      if (bVar4) {
        return bVar6;
      }
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The \"",5);
        poVar12 = std::operator<<((ostream *)local_1a8,LinkLibraryTypeNames[llt]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"\" argument must be followed by a library.",0x29);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      PVar9 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0022);
      if (this->CurrentProcessingState == ProcessingLinkLibraries || WARN < PVar9) {
        bVar4 = false;
      }
      else {
        pcVar11 = this->Target;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
        pcVar15 = cmTarget::GetProperty(pcVar11,(string *)local_1a8);
        bVar4 = pcVar15 == (char *)0x0;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if (bVar4) {
        pcVar11 = this->Target;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,"LINK_INTERFACE_LIBRARIES","");
        cmTarget::SetProperty(pcVar11,&local_1c8,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmTargetLinkLibrariesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // must have one argument
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  if (this->Makefile->IsAlias(args[0]))
    {
    this->SetError("can not be used on an ALIAS target.");
    return false;
    }
  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()
    ->GetGlobalGenerator()->FindTarget(args[0]);
  if(!this->Target)
    {
    cmake::MessageType t = cmake::FATAL_ERROR;  // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2)
      {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016))
        {
        case cmPolicies::WARN:
          t = cmake::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
           break;
        case cmPolicies::OLD:          // OLD behavior does not warn.
          t = cmake::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW:  // NEW behavior prints the error.
          break;
        }
      }

    // now actually print the message
    switch(t)
      {
      case cmake::AUTHOR_WARNING:
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        break;
      case cmake::FATAL_ERROR:
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
      }
    return true;
    }

  if(this->Target->GetType() == cmTarget::OBJECT_LIBRARY)
    {
    std::ostringstream e;
    e << "Object library target \"" << args[0] << "\" "
      << "may not link to anything.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }

  if (this->Target->GetType() == cmTarget::UTILITY)
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0039))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }
    if (modal)
      {
      e <<
        "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if(messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // but we might not have any libs after variable expansion
  if(args.size() < 2)
    {
    return true;
    }

  // Keep track of link configuration specifiers.
  cmTarget::LinkLibraryType llt = cmTarget::GENERAL;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // add libraries, note that there is an optional prefix
  // of debug and optimized that can be used
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "LINK_INTERFACE_LIBRARIES")
      {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if(i != 1)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      }
    else if(args[i] == "INTERFACE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The INTERFACE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
      }
    else if(args[i] == "LINK_PUBLIC")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingPlainPrivateInterface
          && this->CurrentProcessingState != ProcessingPlainPublicInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
      }
    else if(args[i] == "PUBLIC")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
      }
    else if(args[i] == "LINK_PRIVATE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingPlainPublicInterface
          && this->CurrentProcessingState != ProcessingPlainPrivateInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
      }
    else if(args[i] == "PRIVATE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
      }
    else if(args[i] == "debug")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, cmTarget::DEBUG);
        }
      llt = cmTarget::DEBUG;
      haveLLT = true;
      }
    else if(args[i] == "optimized")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, cmTarget::OPTIMIZED);
        }
      llt = cmTarget::OPTIMIZED;
      haveLLT = true;
      }
    else if(args[i] == "general")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, cmTarget::GENERAL);
        }
      llt = cmTarget::GENERAL;
      haveLLT = true;
      }
    else if(haveLLT)
      {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt))
        {
        return false;
        }
      }
    else
      {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there maybe the case where someone has
      // specifed that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = cmTarget::GENERAL;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString =
        this->Makefile->GetDefinition( linkType );
      if(linkTypeString)
        {
        if(strcmp(linkTypeString, "debug") == 0)
          {
          llt = cmTarget::DEBUG;
          }
        if(strcmp(linkTypeString, "optimized") == 0)
          {
          llt = cmTarget::OPTIMIZED;
          }
        }
      if (!this->HandleLibrary(args[i], llt))
        {
        return false;
        }
      }
    }

  // Make sure the last argument was not a library type specifier.
  if(haveLLT)
    {
    std::ostringstream e;
    e << "The \"" << this->LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    }

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if((policy22Status == cmPolicies::OLD ||
      policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
     !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES"))
    {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
    }

  return true;
}